

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sm2.c
# Opt level: O3

int sm2_sig_asn1_decode(uint8_t *r,uint8_t *s,uint8_t *sig,int siglen)

{
  byte bVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  int iVar5;
  int iVar6;
  ulong uVar7;
  ulong __n;
  
  iVar5 = 0;
  iVar6 = 0;
  if ((((s != (uint8_t *)0x0) && (iVar6 = iVar5, r != (uint8_t *)0x0)) && (sig != (uint8_t *)0x0))
     && (((*sig == '0' && (sig[1] < 0x47)) && ((sig[1] + 2 == siglen && (sig[2] == '\x02')))))) {
    bVar1 = sig[3];
    __n = (ulong)bVar1;
    if (0xde < (byte)(bVar1 - 0x22)) {
      if (bVar1 == 0x21) {
        uVar2 = *(undefined8 *)(sig + 5);
        uVar3 = *(undefined8 *)(sig + 0xd);
        uVar4 = *(undefined8 *)(sig + 0x1d);
        *(undefined8 *)(r + 0x10) = *(undefined8 *)(sig + 0x15);
        *(undefined8 *)(r + 0x18) = uVar4;
        *(undefined8 *)r = uVar2;
        *(undefined8 *)(r + 8) = uVar3;
      }
      else {
        uVar7 = (ulong)(0x20 - bVar1);
        memset(r,0,uVar7);
        memcpy(r + uVar7,sig + 4,__n);
      }
      if (sig[__n + 4] == '\x02') {
        bVar1 = sig[__n + 5];
        if (0xde < (byte)(bVar1 - 0x22)) {
          if (bVar1 == 0x21) {
            uVar2 = *(undefined8 *)(sig + __n + 7);
            uVar3 = *(undefined8 *)(sig + __n + 0xf);
            uVar4 = *(undefined8 *)(sig + __n + 0x1f);
            *(undefined8 *)(s + 0x10) = *(undefined8 *)(sig + __n + 0x17);
            *(undefined8 *)(s + 0x18) = uVar4;
            *(undefined8 *)s = uVar2;
            *(undefined8 *)(s + 8) = uVar3;
          }
          else {
            uVar7 = (ulong)(0x20 - bVar1);
            memset(s,0,uVar7);
            memcpy(s + uVar7,sig + __n + 6,(ulong)bVar1);
          }
          iVar6 = 1;
        }
      }
    }
  }
  return iVar6;
}

Assistant:

int sm2_sig_asn1_decode(uint8_t r[32], uint8_t s[32], uint8_t sig[128], int siglen)
{
    int ret = GML_ERROR;
    int r_asn1_len, s_asn1_len;
    int total_len;

    if (sig == NULL || r == NULL || s == NULL)
        goto end;

    if (*sig != 0x30U) // sig = 0x30 ?? 02 ?? r 02 ?? s
        goto end;
    sig++;

    total_len = (int)(*sig); // sig = ?? 02 ?? r 02 ?? s
    if (total_len > 0x46 || siglen != (total_len + 2))
        goto end;
    sig++;

    if (sm2_bn_asn1_decode(r, &r_asn1_len, sig) == GML_ERROR)
        goto end;
    sig += r_asn1_len;

    if (sm2_bn_asn1_decode(s, &s_asn1_len, sig) == GML_ERROR)
        goto end;

    ret = GML_OK;
end:
    return ret;
}